

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

string * util::ToString<unsigned_short>(unsigned_short *t)

{
  ushort *in_RSI;
  string *in_RDI;
  long in_FS_OFFSET;
  ostringstream oss;
  locale local_188;
  ostringstream local_180 [376];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::ostringstream::ostringstream(local_180);
  std::locale::classic();
  std::ios::imbue((locale *)&local_188);
  std::locale::~locale(&local_188);
  std::ostream::operator<<(local_180,*in_RSI);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_180);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string ToString(const T& t)
{
    std::ostringstream oss;
    oss.imbue(std::locale::classic());
    oss << t;
    return oss.str();
}